

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_wear.c
# Opt level: O1

int Shield_on(void)

{
  boolean bVar1;
  
  if (uarms != (obj *)0x0) {
    Oprops_on(uarms,8);
    if (uarms != (obj *)0x0) {
      bVar1 = is_racial_armor(uarms,&youmonst);
      if (bVar1 == '\0') {
        u.uconduct.unracearmor = u.uconduct.unracearmor + 1;
      }
    }
  }
  return 0;
}

Assistant:

static int Shield_on(void)
{
    if (!uarms) return 0;

    Oprops_on(uarms, WORN_SHIELD);

    if (uarms && !is_racial_armor(uarms, &youmonst))
	u.uconduct.unracearmor++;

    /* discover_cursed_equip() called by dowear() */

    return 0;
}